

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.cc
# Opt level: O0

ssize_t __thiscall Pl_RC4::write(Pl_RC4 *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  logic_error *this_00;
  element_type *peVar3;
  Pipeline *pPVar4;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  uchar *local_80;
  size_t bytes;
  uchar *p;
  size_t bytes_left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uchar *local_20;
  size_t len_local;
  uchar *data_local;
  Pl_RC4 *this_local;
  size_t sVar5;
  
  len_local = CONCAT44(in_register_00000034,__fd);
  local_20 = (uchar *)__buf;
  data_local = (uchar *)this;
  bVar1 = std::operator==(&this->outbuf,(nullptr_t)0x0);
  if (!bVar1) {
    p = local_20;
    bytes = len_local;
    sVar5 = len_local;
    while (p != (uchar *)0x0) {
      if (p < (uchar *)this->out_bufsize) {
        local_80 = p;
      }
      else {
        local_80 = (uchar *)this->out_bufsize;
      }
      p = p + -(long)local_80;
      peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->outbuf).
                           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
      RC4::process(&this->rc4,(uchar *)bytes,(size_t)local_80,peVar3);
      bytes = (size_t)(local_80 + bytes);
      pPVar4 = Pipeline::next(&this->super_Pipeline);
      peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->outbuf).
                           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
      iVar2 = (*pPVar4->_vptr_Pipeline[2])(pPVar4,peVar3,local_80);
      sVar5 = CONCAT44(extraout_var,iVar2);
    }
    return sVar5;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,&(this->super_Pipeline).identifier,
                 ": Pl_RC4: write() called after finish() called");
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Pl_RC4::write(unsigned char const* data, size_t len)
{
    if (this->outbuf == nullptr) {
        throw std::logic_error(this->identifier + ": Pl_RC4: write() called after finish() called");
    }

    size_t bytes_left = len;
    unsigned char const* p = data;

    while (bytes_left > 0) {
        size_t bytes = (bytes_left < this->out_bufsize ? bytes_left : out_bufsize);
        bytes_left -= bytes;
        // lgtm[cpp/weak-cryptographic-algorithm]
        rc4.process(p, bytes, outbuf.get());
        p += bytes;
        next()->write(outbuf.get(), bytes);
    }
}